

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O3

void embree::instanceBoundsFunc(RTCBoundsFunctionArguments *args)

{
  void *pvVar1;
  RTCBounds *pRVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar7 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  float fVar35;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [16];
  
  pvVar1 = args->geometryUserPtr;
  pRVar2 = args->bounds_o;
  fVar19 = *(float *)((long)pvVar1 + 0xd0);
  fVar15 = *(float *)((long)pvVar1 + 0xd4);
  fVar10 = *(float *)((long)pvVar1 + 0xd8);
  fVar11 = *(float *)((long)pvVar1 + 0xe0);
  fVar42 = *(float *)((long)pvVar1 + 0xe4);
  fVar47 = *(float *)((long)pvVar1 + 0xe8);
  fVar6 = fVar10 * *(float *)((long)pvVar1 + 0x40) + *(float *)((long)pvVar1 + 0x50);
  fVar8 = fVar10 * *(float *)((long)pvVar1 + 0x44) + *(float *)((long)pvVar1 + 0x54);
  fVar9 = fVar10 * *(float *)((long)pvVar1 + 0x48) + *(float *)((long)pvVar1 + 0x58);
  fVar10 = fVar10 * *(float *)((long)pvVar1 + 0x4c) + *(float *)((long)pvVar1 + 0x5c);
  fVar12 = fVar15 * *(float *)((long)pvVar1 + 0x30);
  fVar13 = fVar15 * *(float *)((long)pvVar1 + 0x34);
  fVar14 = fVar15 * *(float *)((long)pvVar1 + 0x38);
  fVar15 = fVar15 * *(float *)((long)pvVar1 + 0x3c);
  fVar21 = fVar6 + fVar12;
  fVar24 = fVar8 + fVar13;
  fVar25 = fVar9 + fVar14;
  fVar26 = fVar10 + fVar15;
  fVar16 = fVar19 * *(float *)((long)pvVar1 + 0x20);
  fVar17 = fVar19 * *(float *)((long)pvVar1 + 0x24);
  fVar18 = fVar19 * *(float *)((long)pvVar1 + 0x28);
  fVar19 = fVar19 * *(float *)((long)pvVar1 + 0x2c);
  auVar20._0_8_ = CONCAT44(fVar17 + fVar24,fVar16 + fVar21);
  auVar20._8_4_ = fVar18 + fVar25;
  auVar20._12_4_ = fVar19 + fVar26;
  fVar43 = fVar47 * *(float *)((long)pvVar1 + 0x40) + *(float *)((long)pvVar1 + 0x50);
  fVar45 = fVar47 * *(float *)((long)pvVar1 + 0x44) + *(float *)((long)pvVar1 + 0x54);
  fVar46 = fVar47 * *(float *)((long)pvVar1 + 0x48) + *(float *)((long)pvVar1 + 0x58);
  fVar47 = fVar47 * *(float *)((long)pvVar1 + 0x4c) + *(float *)((long)pvVar1 + 0x5c);
  fVar12 = fVar12 + fVar43;
  fVar13 = fVar13 + fVar45;
  fVar14 = fVar14 + fVar46;
  fVar15 = fVar15 + fVar47;
  fVar30 = fVar16 + fVar12;
  fVar31 = fVar17 + fVar13;
  fVar32 = fVar18 + fVar14;
  fVar33 = fVar19 + fVar15;
  fVar35 = fVar42 * *(float *)((long)pvVar1 + 0x30);
  fVar40 = fVar42 * *(float *)((long)pvVar1 + 0x34);
  fVar41 = fVar42 * *(float *)((long)pvVar1 + 0x38);
  fVar42 = fVar42 * *(float *)((long)pvVar1 + 0x3c);
  fVar6 = fVar6 + fVar35;
  fVar8 = fVar8 + fVar40;
  fVar9 = fVar9 + fVar41;
  fVar10 = fVar10 + fVar42;
  auVar34._0_8_ = CONCAT44(fVar17 + fVar8,fVar16 + fVar6);
  auVar34._8_4_ = fVar18 + fVar9;
  auVar34._12_4_ = fVar19 + fVar10;
  fVar35 = fVar35 + fVar43;
  fVar40 = fVar40 + fVar45;
  fVar41 = fVar41 + fVar46;
  fVar42 = fVar42 + fVar47;
  fVar16 = fVar16 + fVar35;
  fVar17 = fVar17 + fVar40;
  fVar18 = fVar18 + fVar41;
  fVar19 = fVar19 + fVar42;
  fVar47 = fVar11 * *(float *)((long)pvVar1 + 0x20);
  fVar43 = fVar11 * *(float *)((long)pvVar1 + 0x24);
  fVar45 = fVar11 * *(float *)((long)pvVar1 + 0x28);
  fVar11 = fVar11 * *(float *)((long)pvVar1 + 0x2c);
  auVar22._0_8_ = CONCAT44(fVar24 + fVar43,fVar21 + fVar47);
  auVar22._8_4_ = fVar25 + fVar45;
  auVar22._12_4_ = fVar26 + fVar11;
  fVar12 = fVar12 + fVar47;
  fVar13 = fVar13 + fVar43;
  fVar14 = fVar14 + fVar45;
  fVar15 = fVar15 + fVar11;
  auVar7._0_8_ = CONCAT44(fVar8 + fVar43,fVar6 + fVar47);
  auVar7._8_4_ = fVar9 + fVar45;
  auVar7._12_4_ = fVar10 + fVar11;
  fVar47 = fVar47 + fVar35;
  fVar43 = fVar43 + fVar40;
  fVar45 = fVar45 + fVar41;
  fVar11 = fVar11 + fVar42;
  auVar27._8_4_ = auVar20._8_4_;
  auVar27._0_8_ = auVar20._0_8_;
  auVar27._12_4_ = auVar20._12_4_;
  auVar4._4_4_ = fVar31;
  auVar4._0_4_ = fVar30;
  auVar4._8_4_ = fVar32;
  auVar4._12_4_ = fVar33;
  auVar28 = minps(auVar27,auVar4);
  auVar36._8_4_ = auVar34._8_4_;
  auVar36._0_8_ = auVar34._0_8_;
  auVar36._12_4_ = auVar34._12_4_;
  auVar29._4_4_ = fVar17;
  auVar29._0_4_ = fVar16;
  auVar29._8_4_ = fVar18;
  auVar29._12_4_ = fVar19;
  auVar37 = minps(auVar36,auVar29);
  auVar37 = minps(auVar28,auVar37);
  auVar38._8_4_ = auVar22._8_4_;
  auVar38._0_8_ = auVar22._0_8_;
  auVar38._12_4_ = auVar22._12_4_;
  auVar39._4_4_ = fVar13;
  auVar39._0_4_ = fVar12;
  auVar39._8_4_ = fVar14;
  auVar39._12_4_ = fVar15;
  auVar39 = minps(auVar38,auVar39);
  auVar44._8_4_ = auVar7._8_4_;
  auVar44._0_8_ = auVar7._0_8_;
  auVar44._12_4_ = auVar7._12_4_;
  auVar28._4_4_ = fVar43;
  auVar28._0_4_ = fVar47;
  auVar28._8_4_ = fVar45;
  auVar28._12_4_ = fVar11;
  auVar28 = minps(auVar44,auVar28);
  auVar28 = minps(auVar39,auVar28);
  auVar29 = minps(auVar37,auVar28);
  auVar5._4_4_ = fVar31;
  auVar5._0_4_ = fVar30;
  auVar5._8_4_ = fVar32;
  auVar5._12_4_ = fVar33;
  auVar28 = maxps(auVar20,auVar5);
  auVar3._4_4_ = fVar17;
  auVar3._0_4_ = fVar16;
  auVar3._8_4_ = fVar18;
  auVar3._12_4_ = fVar19;
  auVar37 = maxps(auVar34,auVar3);
  auVar39 = maxps(auVar28,auVar37);
  auVar23._4_4_ = fVar13;
  auVar23._0_4_ = fVar12;
  auVar23._8_4_ = fVar14;
  auVar23._12_4_ = fVar15;
  auVar23 = maxps(auVar22,auVar23);
  auVar37._4_4_ = fVar43;
  auVar37._0_4_ = fVar47;
  auVar37._8_4_ = fVar45;
  auVar37._12_4_ = fVar11;
  auVar28 = maxps(auVar7,auVar37);
  auVar28 = maxps(auVar23,auVar28);
  auVar28 = maxps(auVar39,auVar28);
  pRVar2->lower_x = (float)(int)auVar29._0_8_;
  pRVar2->lower_y = (float)(int)((ulong)auVar29._0_8_ >> 0x20);
  pRVar2->lower_z = auVar29._8_4_;
  pRVar2->upper_x = (float)(int)auVar28._0_8_;
  pRVar2->upper_y = (float)(int)((ulong)auVar28._0_8_ >> 0x20);
  pRVar2->upper_z = auVar28._8_4_;
  return;
}

Assistant:

void instanceBoundsFunc(const struct RTCBoundsFunctionArguments* args)
{
  const Instance* instance = (const Instance*) args->geometryUserPtr;
  RTCBounds* bounds_o = args->bounds_o;
  Vec3fa l = instance->lower;
  Vec3fa u = instance->upper;
  Vec3fa p000 = xfmPoint(instance->local2world,Vec3fa(l.x,l.y,l.z));
  Vec3fa p001 = xfmPoint(instance->local2world,Vec3fa(l.x,l.y,u.z));
  Vec3fa p010 = xfmPoint(instance->local2world,Vec3fa(l.x,u.y,l.z));
  Vec3fa p011 = xfmPoint(instance->local2world,Vec3fa(l.x,u.y,u.z));
  Vec3fa p100 = xfmPoint(instance->local2world,Vec3fa(u.x,l.y,l.z));
  Vec3fa p101 = xfmPoint(instance->local2world,Vec3fa(u.x,l.y,u.z));
  Vec3fa p110 = xfmPoint(instance->local2world,Vec3fa(u.x,u.y,l.z));
  Vec3fa p111 = xfmPoint(instance->local2world,Vec3fa(u.x,u.y,u.z));
  Vec3fa lower = min(min(min(p000,p001),min(p010,p011)),min(min(p100,p101),min(p110,p111)));
  Vec3fa upper = max(max(max(p000,p001),max(p010,p011)),max(max(p100,p101),max(p110,p111)));
  bounds_o->lower_x = lower.x;
  bounds_o->lower_y = lower.y;
  bounds_o->lower_z = lower.z;
  bounds_o->upper_x = upper.x;
  bounds_o->upper_y = upper.y;
  bounds_o->upper_z = upper.z;
}